

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSetFull::ToEquivClass<char16_t>
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<char16_t> *result,codepoint_t baseOffset)

{
  Char lc;
  Char hc;
  uint uVar1;
  int iVar2;
  int local_4c;
  int i;
  uint n;
  char16_t equivl [4];
  uint acth;
  uint h;
  uint l;
  CharSet<char16_t> *result_local;
  uint *tblidx_local;
  uint base_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetFull *this_local;
  
  iVar2 = 0;
  if (level == 2) {
    iVar2 = 0xff;
  }
  acth = base + iVar2 + baseOffset;
  uVar1 = CharSetNode::lim(level);
  equivl._4_4_ = base + uVar1 + baseOffset;
  do {
    CaseInsensitive::RangeToEquivClass(tblidx,acth,equivl._4_4_,(uint *)equivl,(char16 *)&i);
    iVar2 = equivl._0_4_ - acth;
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      lc = *(Char *)((long)&i + (long)local_4c * 2);
      hc = Chars<char16_t>::Shift(*(Char *)((long)&i + (long)local_4c * 2),iVar2);
      CharSet<char16_t>::SetRange(result,allocator,lc,hc);
    }
    acth = equivl._0_4_ + 1;
  } while (acth <= (uint)equivl._4_4_);
  return;
}

Assistant:

void CharSetFull::ToEquivClass(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        uint l = base + (CharSetNode::levels - 1 == level ? 0xff : 0) + baseOffset;
        uint h = base + lim(level) + baseOffset;

        do
        {
            uint acth;
            C equivl[CaseInsensitive::EquivClassSize];
            CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
            uint n = acth - l;
            for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
            {
                result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
            }

            // Go around again for rest of this range
            l = acth + 1;
        }
        while (l <= h);
    }